

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.cc
# Opt level: O1

bool __thiscall flow::diagnostics::Message::operator==(Message *this,Message *other)

{
  size_t __n;
  int iVar1;
  
  if ((((this->type == other->type) &&
       ((this->sourceLocation).begin.line == (other->sourceLocation).begin.line)) &&
      ((this->sourceLocation).begin.column == (other->sourceLocation).begin.column)) &&
     (((this->sourceLocation).begin.offset == (other->sourceLocation).begin.offset &&
      (__n = (this->text)._M_string_length, __n == (other->text)._M_string_length)))) {
    if (__n != 0) {
      iVar1 = bcmp((this->text)._M_dataplus._M_p,(other->text)._M_dataplus._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool Message::operator==(const Message& other) const noexcept {
  // XXX ignore SourceLocation's filename & end
  return type == other.type &&
         sourceLocation.begin == other.sourceLocation.begin &&
         text == other.text;
}